

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

void __thiscall
CTcHostIfcDynComp::v_print_err(CTcHostIfcDynComp *this,char *msg,__va_list_tag *args)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  size_t __size;
  long lVar3;
  
  __s = t3vsprintf_alloc(msg,args);
  if (__s == (char *)0x0) {
    return;
  }
  sVar1 = strlen(__s);
  lVar3 = (long)this->p_ - (long)this->errmsg_;
  if (this->erralo_ < sVar1 + lVar3 + 1) {
    __size = lVar3 + sVar1 + 0x401;
    this->erralo_ = __size;
    pcVar2 = (char *)realloc(this->errmsg_,__size);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    this->errmsg_ = pcVar2;
    this->p_ = pcVar2 + lVar3;
  }
  memcpy(this->p_,__s,sVar1 + 1);
  this->p_ = this->p_ + sVar1;
  free(__s);
  return;
}

Assistant:

virtual void v_print_err(const char *msg, va_list args)
    {
        /* format the message */
        char *f = t3vsprintf_alloc(msg, args);
        if (f == 0)
            return;
        
        /* get the length */
        size_t len = strlen(f);
        
        /* expand our buffer if necessary */
        size_t curlen = p_ - errmsg_;
        size_t need = curlen + len + 1;
        if (need > erralo_)
        {
            erralo_ = need + 1024;
            char *newbuf = (char *)t3realloc(errmsg_, erralo_);
            if (newbuf == 0)
                return;
            
            /* switch to the new buffer */
            errmsg_ = newbuf;
            p_ = errmsg_ + curlen;
        }
        
        /* append the message */
        memcpy(p_, f, len + 1);
        
        /* bump the write pointer */
        p_ += len;

        /* done with the allocated message text */
        t3free(f);
    }